

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_conv_transpose_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  size_t sVar14;
  undefined4 *puVar15;
  long lVar16;
  void *pvVar17;
  char *pcVar18;
  undefined2 *puVar19;
  undefined4 *puVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  undefined2 *puVar26;
  undefined4 *puVar27;
  long lVar28;
  long lVar29;
  undefined2 *puVar30;
  undefined4 *puVar31;
  long lVar32;
  float *pfVar33;
  undefined1 auVar34 [16];
  long local_b0;
  float *local_a0;
  long local_98;
  int local_80;
  int local_78;
  float local_38;
  float local_34;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type == GGML_TYPE_F32) {
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 4) {
          if (pgVar3->nb[0] == 4) {
            lVar4 = pgVar2->ne[0];
            lVar24 = pgVar2->ne[1];
            lVar5 = pgVar2->ne[2];
            lVar6 = pgVar3->ne[0];
            lVar7 = pgVar3->ne[1];
            iVar8 = dst->ne[1];
            sVar9 = dst->nb[1];
            iVar21 = params->ith;
            iVar13 = params->nth;
            lVar16 = lVar5 * lVar4;
            local_80 = (int)lVar16 * (int)lVar24;
            if (iVar21 == 0) {
              sVar10 = pgVar2->nb[1];
              sVar11 = pgVar2->nb[2];
              sVar12 = pgVar3->nb[1];
              memset(params->wdata,0,params->wsize);
              puVar15 = (undefined4 *)params->wdata;
              if (0 < lVar5) {
                lVar23 = 0;
                lVar28 = 0;
                puVar27 = puVar15;
                do {
                  if (0 < lVar24) {
                    lVar29 = (long)pgVar2->data + lVar23;
                    lVar32 = 0;
                    puVar31 = puVar27;
                    do {
                      if (0 < lVar4) {
                        lVar22 = 0;
                        puVar20 = puVar31;
                        do {
                          *puVar20 = *(undefined4 *)(lVar29 + lVar22 * 4);
                          lVar22 = lVar22 + 1;
                          puVar20 = puVar20 + lVar5;
                        } while (lVar4 != lVar22);
                      }
                      lVar32 = lVar32 + 1;
                      puVar31 = puVar31 + lVar16;
                      lVar29 = lVar29 + sVar10;
                    } while (lVar32 != lVar24);
                  }
                  lVar28 = lVar28 + 1;
                  puVar27 = puVar27 + 1;
                  lVar23 = lVar23 + sVar11;
                } while (lVar28 != lVar5);
              }
              if (0 < lVar7) {
                puVar15 = puVar15 + local_80;
                pvVar17 = pgVar3->data;
                lVar24 = 0;
                do {
                  if (0 < lVar6) {
                    lVar23 = 0;
                    puVar27 = puVar15;
                    do {
                      *puVar27 = *(undefined4 *)((long)pvVar17 + lVar23 * 4);
                      lVar23 = lVar23 + 1;
                      puVar27 = puVar27 + lVar7;
                    } while (lVar6 != lVar23);
                  }
                  lVar24 = lVar24 + 1;
                  puVar15 = puVar15 + 1;
                  pvVar17 = (void *)((long)pvVar17 + sVar12);
                } while (lVar24 != lVar7);
              }
              pvVar17 = dst->data;
              sVar14 = ggml_nbytes();
              memset(pvVar17,0,sVar14);
            }
            ggml_barrier(params->threadpool);
            iVar1 = (int)iVar8;
            iVar13 = (iVar1 + -1 + iVar13) / iVar13;
            iVar21 = iVar21 * iVar13;
            iVar13 = iVar13 + iVar21;
            if (iVar1 <= iVar13) {
              iVar13 = iVar1;
            }
            if (iVar13 <= iVar21) {
              return;
            }
            pvVar17 = params->wdata;
            iVar1 = dst->op_params[0];
            lVar24 = (long)iVar21;
            local_b0 = sVar9 * lVar24;
            local_a0 = (float *)((long)pvVar17 + lVar16 * lVar24 * 4);
            do {
              if (0 < lVar6) {
                lVar23 = (long)dst->data + local_b0;
                local_98 = 0;
                do {
                  if (0 < lVar4) {
                    lVar28 = 0;
                    pfVar33 = local_a0;
                    do {
                      local_34 = 0.0;
                      ggml_vec_dot_f32((int)lVar5,&local_34,0,
                                       (float *)((long)pvVar17 +
                                                ((lVar7 << 0x20) * local_98 >> 0x1e) +
                                                (long)local_80 * 4),0,pfVar33,0,1);
                      *(float *)(lVar23 + lVar28 * 4) = local_34 + *(float *)(lVar23 + lVar28 * 4);
                      lVar28 = lVar28 + 1;
                      pfVar33 = pfVar33 + lVar5;
                    } while (lVar4 != lVar28);
                  }
                  local_98 = local_98 + 1;
                  lVar23 = lVar23 + (long)iVar1 * 4;
                } while (local_98 != lVar6);
              }
              lVar24 = lVar24 + 1;
              local_b0 = local_b0 + sVar9;
              local_a0 = local_a0 + lVar16;
            } while (iVar13 != (int)lVar24);
            return;
          }
          pcVar18 = "nb10 == sizeof(float)";
          uVar25 = 0x15ed;
        }
        else {
          pcVar18 = "nb00 == sizeof(float)";
          uVar25 = 0x15ec;
        }
      }
      else {
        pcVar18 = "dst->type == GGML_TYPE_F32";
        uVar25 = 0x15e3;
      }
    }
    else {
      pcVar18 = "src1->type == GGML_TYPE_F32";
      uVar25 = 0x15e2;
    }
  }
  else {
    if (pgVar2->type != GGML_TYPE_F16) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1643,"fatal error");
    }
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 2) {
          if (pgVar3->nb[0] == 4) {
            lVar4 = pgVar2->ne[0];
            lVar24 = pgVar2->ne[1];
            lVar5 = pgVar2->ne[2];
            lVar6 = pgVar3->ne[0];
            lVar7 = pgVar3->ne[1];
            iVar8 = dst->ne[1];
            sVar9 = dst->nb[1];
            iVar21 = params->ith;
            iVar13 = params->nth;
            lVar16 = lVar5 * lVar4;
            local_78 = (int)lVar16 * (int)lVar24;
            if (iVar21 == 0) {
              sVar10 = pgVar2->nb[1];
              sVar11 = pgVar2->nb[2];
              sVar12 = pgVar3->nb[1];
              memset(params->wdata,0,params->wsize);
              puVar26 = (undefined2 *)params->wdata;
              if (0 < lVar5) {
                lVar23 = 0;
                lVar28 = 0;
                do {
                  if (0 < lVar24) {
                    lVar29 = (long)pgVar2->data + lVar23;
                    lVar32 = 0;
                    puVar30 = puVar26;
                    do {
                      if (0 < lVar4) {
                        lVar22 = 0;
                        puVar19 = puVar30;
                        do {
                          *puVar19 = *(undefined2 *)(lVar29 + lVar22 * 2);
                          lVar22 = lVar22 + 1;
                          puVar19 = puVar19 + lVar5;
                        } while (lVar4 != lVar22);
                      }
                      lVar32 = lVar32 + 1;
                      puVar30 = puVar30 + lVar16;
                      lVar29 = lVar29 + sVar10;
                    } while (lVar32 != lVar24);
                  }
                  lVar28 = lVar28 + 1;
                  puVar26 = puVar26 + 1;
                  lVar23 = lVar23 + sVar11;
                } while (lVar28 != lVar5);
              }
              if (0 < lVar7) {
                pvVar17 = pgVar3->data;
                lVar24 = 0;
                do {
                  if (0 < lVar6) {
                    lVar23 = 0;
                    do {
                      auVar34 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar17 + lVar23 * 4)),0);
                      vpextrw_avx(auVar34,0);
                      lVar23 = lVar23 + 1;
                    } while (lVar6 != lVar23);
                  }
                  lVar24 = lVar24 + 1;
                  pvVar17 = (void *)((long)pvVar17 + sVar12);
                } while (lVar24 != lVar7);
              }
              pvVar17 = dst->data;
              sVar14 = ggml_nbytes();
              memset(pvVar17,0,sVar14);
            }
            ggml_barrier(params->threadpool);
            iVar1 = (int)iVar8;
            iVar13 = (iVar1 + -1 + iVar13) / iVar13;
            iVar21 = iVar21 * iVar13;
            iVar13 = iVar13 + iVar21;
            if (iVar1 <= iVar13) {
              iVar13 = iVar1;
            }
            if (iVar21 < iVar13) {
              pvVar17 = params->wdata;
              iVar1 = dst->op_params[0];
              lVar24 = (long)iVar21;
              local_b0 = sVar9 * lVar24;
              local_a0 = (float *)((long)pvVar17 + lVar16 * lVar24 * 2);
              do {
                if (0 < lVar6) {
                  lVar23 = (long)dst->data + local_b0;
                  local_98 = 0;
                  do {
                    if (0 < lVar4) {
                      lVar28 = 0;
                      pfVar33 = local_a0;
                      do {
                        local_38 = 0.0;
                        ggml_vec_dot_f16((int)lVar5,&local_38,0,
                                         (ggml_fp16_t *)
                                         ((long)pvVar17 +
                                         ((lVar7 << 0x20) * local_98 >> 0x1f) + (long)local_78 * 2),
                                         0,(ggml_fp16_t *)pfVar33,0,1);
                        *(float *)(lVar23 + lVar28 * 4) = local_38 + *(float *)(lVar23 + lVar28 * 4)
                        ;
                        lVar28 = lVar28 + 1;
                        pfVar33 = (float *)((long)pfVar33 + lVar5 * 2);
                      } while (lVar4 != lVar28);
                    }
                    local_98 = local_98 + 1;
                    lVar23 = lVar23 + (long)iVar1 * 4;
                  } while (local_98 != lVar6);
                }
                lVar24 = lVar24 + 1;
                local_b0 = local_b0 + sVar9;
                local_a0 = (float *)((long)local_a0 + lVar16 * 2);
              } while (iVar13 != (int)lVar24);
            }
            return;
          }
          pcVar18 = "nb10 == sizeof(float)";
          uVar25 = 0x1595;
        }
        else {
          pcVar18 = "nb00 == sizeof(ggml_fp16_t)";
          uVar25 = 0x1594;
        }
      }
      else {
        pcVar18 = "dst->type == GGML_TYPE_F32";
        uVar25 = 0x158b;
      }
    }
    else {
      pcVar18 = "src1->type == GGML_TYPE_F32";
      uVar25 = 0x158a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar18);
}

Assistant:

void ggml_compute_forward_conv_transpose_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_conv_transpose_1d_f16_f32(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_conv_transpose_1d_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}